

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

void Abc_NtkDetectClassesTest(Abc_Ntk_t *pNtk,int fSeq,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Wec_t *p;
  abctime aVar4;
  abctime clk;
  Vec_Wec_t *vResult;
  int fVeryVerbose_local;
  int fVerbose_local;
  int fSeq_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar3 = Abc_Clock();
  if (fSeq != 0) {
    Abc_NtkFrameExtend(pNtk);
  }
  p = Abc_NtkDetectFinClasses(pNtk,fVerbose);
  uVar1 = Vec_WecSize(p);
  uVar2 = Abc_NtkFinCountPairs(p);
  printf("Computed %d equivalence classes with %d item pairs.  ",(ulong)uVar1,(ulong)uVar2);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  if (fVeryVerbose != 0) {
    Vec_WecPrint(p,1);
  }
  Vec_WecFree(p);
  return;
}

Assistant:

void Abc_NtkDetectClassesTest( Abc_Ntk_t * pNtk, int fSeq, int fVerbose, int fVeryVerbose )
{
    Vec_Wec_t * vResult;
    abctime clk = Abc_Clock();
    if ( fSeq ) 
        Abc_NtkFrameExtend( pNtk );
    vResult = Abc_NtkDetectFinClasses( pNtk, fVerbose );
    printf( "Computed %d equivalence classes with %d item pairs.  ", Vec_WecSize(vResult), Abc_NtkFinCountPairs(vResult) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVeryVerbose )
        Vec_WecPrint( vResult, 1 );
//    if ( fVerbose )
//        Abc_NtkPrintFinResults( vResult );
    Vec_WecFree( vResult );
}